

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lvm.c
# Opt level: O0

void luaV_settable(lua_State *L,TValue *t,TValue *key,StkId val)

{
  Value VVar1;
  int iVar2;
  lua_Integer *data_4;
  lua_Integer lStack_b0;
  uint ukey_4;
  lua_Integer i;
  lua_Integer *data_3;
  RaviArray *pRStack_98;
  uint ukey_3;
  RaviArray *h_2;
  lua_Number *data_2;
  GCObject *pGStack_80;
  uint ukey_2;
  lua_Number d;
  lua_Number *data_1;
  char *pcStack_68;
  uint ukey_1;
  lua_Number *data;
  RaviArray *pRStack_58;
  uint ukey;
  RaviArray *h_1;
  TValue *io2;
  TValue *io1;
  Table *h;
  lua_Integer idx;
  TValue *slot;
  StkId val_local;
  TValue *key_local;
  TValue *t_local;
  lua_State *L_local;
  
  slot = val;
  val_local = key;
  key_local = t;
  t_local = (TValue *)L;
  if (t->tt_ == 0x8005) {
    if (key->tt_ == 0x13) {
      if (key->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      h = (Table *)(key->value_).gc;
      if (t->tt_ != 0x8005) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      if (((t->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      io1 = (TValue *)(t->value_).gc;
      if (&h[-1].field_0x3f < (undefined1 *)(ulong)((Table *)io1)->sizearray) {
        idx = (lua_Integer)(((Table *)io1)->array + (long)&h[-1].field_0x3f);
      }
      else {
        idx = (lua_Integer)luaH_getint((Table *)io1,(lua_Integer)h);
      }
    }
    else {
      if (t->tt_ != 0x8005) {
        __assert_fail("((((t))->tt_) == (((5) | (1 << 15))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      if (((t->value_).gc)->tt != '\x05') {
        __assert_fail("(((t)->value_).gc)->tt == 5",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      idx = (lua_Integer)luaH_get((Table *)(t->value_).gc,key);
    }
    if (*(short *)(idx + 8) == 0) {
      luaV_finishset((lua_State *)t_local,key_local,val_local,slot,(TValue *)idx);
    }
    else {
      io2 = (TValue *)idx;
      h_1 = (RaviArray *)slot;
      *(Value *)idx = slot->value_;
      *(LuaType *)(idx + 8) = slot->tt_;
      if ((*(ushort *)(idx + 8) & 0x8000) != 0) {
        if ((*(ushort *)(idx + 8) & 0x8000) == 0) {
          __assert_fail("(((io1)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        if ((*(ushort *)(idx + 8) & 0x7f) != (ushort)*(byte *)(*(long *)idx + 8)) {
LAB_0015e09c:
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        if (t_local != (TValue *)0x0) {
          if ((*(ushort *)(idx + 8) & 0x8000) == 0) {
            __assert_fail("(((io1)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)")
            ;
          }
          if ((*(byte *)(*(long *)idx + 9) & (*(byte *)(*(long *)&t_local[1].tt_ + 0x54) ^ 0x18)) !=
              0) goto LAB_0015e09c;
        }
      }
      if ((slot->tt_ & 0x8000) != 0) {
        if ((key_local->tt_ & 0x8000) == 0) {
          __assert_fail("(((t)->tt_) & (1 << 15))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        if ((((key_local->value_).gc)->marked & 0x20) != 0) {
          if ((slot->tt_ & 0x8000) == 0) {
            __assert_fail("(((val)->tt_) & (1 << 15))",
                          "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                          ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)")
            ;
          }
          if ((((slot->value_).gc)->marked & 0x18) != 0) {
            if ((key_local->tt_ & 0x8000) == 0) {
              __assert_fail("(((t)->tt_) & (1 << 15))",
                            "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                            ,0x215,
                            "void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
            }
            luaC_barrierback_((lua_State *)t_local,(key_local->value_).gc);
          }
        }
      }
    }
  }
  else if (t->tt_ == 0x8025) {
    if ((t->tt_ != 0x8015) && (t->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
    }
    if ((((t->value_).gc)->tt != '\x15') && (((t->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
    }
    pRStack_58 = (RaviArray *)(t->value_).gc;
    if (key->tt_ != 0x13) {
      luaG_typeerror(L,key,"index");
    }
    if (val->tt_ == 3) {
      if (key->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      VVar1 = key->value_;
      data._4_4_ = VVar1.b;
      pcStack_68 = pRStack_58->data;
      if (data._4_4_ < pRStack_58->len) {
        if (val->tt_ != 3) {
          __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        *(Value *)(pcStack_68 + (VVar1.i & 0xffffffffU) * 8) = val->value_;
      }
      else {
        if (val->tt_ != 3) {
          __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        raviH_set_float(L,pRStack_58,VVar1.i & 0xffffffff,(val->value_).n);
      }
    }
    else if (val->tt_ == 0x13) {
      if (key->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      VVar1 = key->value_;
      data_1._4_4_ = VVar1.b;
      d = (lua_Number)pRStack_58->data;
      if (data_1._4_4_ < pRStack_58->len) {
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        *(double *)((long)d + (VVar1.i & 0xffffffffU) * 8) = (double)(val->value_).i;
      }
      else {
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        raviH_set_float(L,pRStack_58,VVar1.i & 0xffffffff,(double)(val->value_).i);
      }
    }
    else {
      pGStack_80 = (GCObject *)0x0;
      if (val->tt_ == 3) {
        if (val->tt_ != 3) {
          __assert_fail("((((val))->tt_) == (((3) | ((0) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        pGStack_80 = (GCObject *)(val->value_).n;
      }
      else {
        if (val->tt_ != 0x13) {
          luaG_runerror(L,"value cannot be converted to number");
        }
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        pGStack_80 = (GCObject *)(double)(val->value_).i;
      }
      if (key->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      VVar1 = key->value_;
      data_2._4_4_ = VVar1.b;
      h_2 = (RaviArray *)pRStack_58->data;
      if (data_2._4_4_ < pRStack_58->len) {
        (&h_2->next)[VVar1.i & 0xffffffff] = pGStack_80;
      }
      else {
        raviH_set_float(L,pRStack_58,VVar1.i & 0xffffffff,(lua_Number)pGStack_80);
      }
    }
  }
  else if (t->tt_ == 0x8015) {
    if ((t->tt_ != 0x8015) && (t->tt_ != 0x8025)) {
      __assert_fail("(((((t))->tt_) == (((((5) | ((1) << 4))) | (1 << 15)))) || ((((t))->tt_) == (((((5) | ((2) << 4))) | (1 << 15)))))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
    }
    if ((((t->value_).gc)->tt != '\x15') && (((t->value_).gc)->tt != '%')) {
      __assert_fail("((((t)->value_).gc)->tt == ((5) | ((1) << 4)) || (((t)->value_).gc)->tt == ((5) | ((2) << 4)))"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                    ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
    }
    pRStack_98 = (RaviArray *)(t->value_).gc;
    if (key->tt_ != 0x13) {
      luaG_typeerror(L,key,"index");
    }
    if (val->tt_ == 0x13) {
      if (key->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      VVar1 = key->value_;
      data_3._4_4_ = VVar1.b;
      i = (lua_Integer)pRStack_98->data;
      if (data_3._4_4_ < pRStack_98->len) {
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        *(Value *)(i + (VVar1.i & 0xffffffffU) * 8) = val->value_;
      }
      else {
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        raviH_set_int(L,pRStack_98,VVar1.i & 0xffffffff,(val->value_).i);
      }
    }
    else {
      lStack_b0 = 0;
      if (val->tt_ == 0x13) {
        if (val->tt_ != 0x13) {
          __assert_fail("((((val))->tt_) == (((3) | ((1) << 4))))",
                        "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                        ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
        }
        lStack_b0 = (val->value_).i;
      }
      else {
        iVar2 = luaV_tointegerns(val,&stack0xffffffffffffff50,F2Ieq);
        if (iVar2 == 0) {
          luaG_runerror((lua_State *)t_local,"value cannot be converted to integer");
        }
      }
      if (val_local->tt_ != 0x13) {
        __assert_fail("((((key))->tt_) == (((3) | ((1) << 4))))",
                      "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/lvm.c"
                      ,0x215,"void luaV_settable(lua_State *, const TValue *, TValue *, StkId)");
      }
      VVar1 = val_local->value_;
      if ((uint)VVar1.b < pRStack_98->len) {
        *(lua_Integer *)(pRStack_98->data + (VVar1.i & 0xffffffffU) * 8) = lStack_b0;
      }
      else {
        raviH_set_int((lua_State *)t_local,pRStack_98,VVar1.i & 0xffffffff,lStack_b0);
      }
    }
  }
  else {
    luaV_finishset(L,t,key,val,(TValue *)0x0);
  }
  return;
}

Assistant:

void luaV_settable (lua_State *L, const TValue *t, TValue *key, StkId val) {
  SETTABLE_INLINE(L, t, key, val);
}